

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver.c
# Opt level: O0

void receiver_run(receiver *rx,short *buf,int len)

{
  int iVar1;
  time_t tVar2;
  int local_803c;
  float local_8038;
  int i;
  float filtered [8192];
  int rx_num_ch;
  float level;
  int level_distance;
  short maxval;
  char b;
  int bit;
  int curr;
  float out;
  int len_local;
  short *buf_local;
  receiver *rx_local;
  
  level._0_2_ = 0;
  filtered[0x1ffe] = (float)rx->num_ch;
  _out = buf + rx->ch_ofs;
  curr = len;
  buf_local = (short *)rx;
  if (len < 0x2001) {
    level._0_2_ = filter_run_buf(rx->filter,_out,&local_8038,(int)filtered[0x1ffe],len);
    for (local_803c = 0; local_803c < curr; local_803c = local_803c + 1) {
      bit = (int)(&local_8038)[local_803c];
      _maxval = (uint)(0.0 < (float)bit);
      if ((_maxval ^ *(uint *)(buf_local + 0x14)) == 1) {
        if (*(uint *)(buf_local + 0xc) < 0x8000) {
          *(uint *)(buf_local + 0xc) = (*(uint *)(buf_local + 0xe) >> 4) + *(int *)(buf_local + 0xc)
          ;
        }
        else {
          *(uint *)(buf_local + 0xc) = *(int *)(buf_local + 0xc) - (*(uint *)(buf_local + 0xe) >> 4)
          ;
        }
      }
      *(uint *)(buf_local + 0x14) = _maxval;
      *(int *)(buf_local + 0xc) = *(int *)(buf_local + 0xe) + *(int *)(buf_local + 0xc);
      if (0xffff < *(uint *)(buf_local + 0xc)) {
        level_distance = (int)(0.0 < (float)bit);
        level._3_1_ = (level_distance != *(uint *)(buf_local + 6) ^ 0xffU) & 1;
        protodec_decode((char *)((long)&level + 3),1,*(demod_state_t **)(buf_local + 0x10));
        *(int *)(buf_local + 6) = level_distance;
        *(uint *)(buf_local + 0xc) = *(uint *)(buf_local + 0xc) & 0xffff;
      }
    }
    filtered[0x1fff] = ((float)(int)level._0_2_ / 32768.0) * 100.0;
    tVar2 = time((time_t *)0x0);
    iVar1 = (int)tVar2 - (int)*(undefined8 *)(buf_local + 0x18);
    if ((filtered[0x1fff] <= 95.0) || ((iVar1 < 0x1e && (iVar1 < sound_levellog)))) {
      if ((sound_levellog != 0) && (sound_levellog <= iVar1)) {
        if (on_sound_level_changed != (receiver_on_level_changed)0x0) {
          (*on_sound_level_changed)(filtered[0x1fff],*(int *)(buf_local + 10),'\0');
        }
        time((time_t *)(buf_local + 0x18));
      }
    }
    else {
      if (on_sound_level_changed != (receiver_on_level_changed)0x0) {
        (*on_sound_level_changed)(filtered[0x1fff],*(int *)(buf_local + 10),'\x01');
      }
      time((time_t *)(buf_local + 0x18));
    }
    return;
  }
  abort();
}

Assistant:

void receiver_run(struct receiver *rx, short *buf, int len)
{
	float out;
	int curr, bit;
	char b;
	short maxval = 0;
	int level_distance;
	float level;
	int rx_num_ch = rx->num_ch;
    float filtered[FILTERED_LEN];
	int i;
	
	/* len is number of samples available in buffer for each
	 * channels - something like 1024, regardless of number of channels */
	
	buf += rx->ch_ofs;
	
	if (len > FILTERED_LEN)
		abort();

	maxval = filter_run_buf(rx->filter, buf, filtered, rx_num_ch, len);
	
	for (i = 0; i < len; i++) {
		out = filtered[i];
		curr = (out > 0);
		
		if ((curr ^ rx->prev) == 1) {
			if (rx->pll < (0x10000 / 2)) {
				rx->pll += rx->pllinc / INC;
			} else {
				rx->pll -= rx->pllinc / INC;
			}
		}
		rx->prev = curr;

		rx->pll += rx->pllinc;

		if (rx->pll > 0xffff) {
			/* slice */
			bit = (out > 0);
			/* nrzi decode */
			b = !(bit ^ rx->lastbit);
			/* feed to the decoder */
			protodec_decode(&b, 1, rx->decoder);

			rx->lastbit = bit;
			rx->pll &= 0xffff;
		}
	}
	
	/* calculate level, and log it */
	level = (float)maxval / (float)32768 * (float)100;
	level_distance = time(NULL) - rx->last_levellog;
	
    if (level > 95.0 && (level_distance >= 30 || level_distance >= sound_levellog)) {
        if (on_sound_level_changed != NULL) on_sound_level_changed(level, rx->ch_ofs, 1);
        time(&rx->last_levellog);
    } else if (sound_levellog != 0 && level_distance >= sound_levellog) {
        if (on_sound_level_changed != NULL) on_sound_level_changed(level, rx->ch_ofs, 0);
        time(&rx->last_levellog);
    }
}